

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void av1_make_default_fullpel_ms_params
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
               ,MV *ref_mv,FULLPEL_MV start_mv,search_site_config *search_sites,
               SEARCH_METHODS search_method,int fine_search_interval)

{
  char cVar1;
  undefined8 uVar2;
  buf_2d *pbVar3;
  uint8_t *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  FullMvLimits *pFVar8;
  uint8_t *puVar9;
  BLOCK_SIZE in_CL;
  long in_RDX;
  long *in_RSI;
  FULLPEL_MOTION_SEARCH_PARAMS *in_RDI;
  MV *in_R8;
  search_site_config *in_stack_00000008;
  SEARCH_METHODS in_stack_00000010;
  int in_stack_00000018;
  int mult_thresh;
  int odd_to_even_diff_sad;
  uint start_mv_sad_odd_rows;
  uint start_mv_sad_even_rows;
  int src_stride;
  uint8_t *src_buf;
  buf_2d *src;
  uint8_t *best_address;
  int ref_stride;
  buf_2d *ref;
  FULLPEL_MV start_mv_clamped;
  FullMvLimits *mv_limits;
  int right_margin;
  int bottom_margin;
  int left_margin;
  int top_margin;
  int is_key_frame;
  MV_SPEED_FEATURES *mv_sf;
  MACROBLOCK *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar10;
  
  cVar1 = *(char *)(*in_RSI + 400 + (ulong)*(byte *)(in_RSI + 0xe258));
  in_RDI->bsize = in_CL;
  in_RDI->vfp = (aom_variance_fn_ptr_t *)(*in_RSI + 0xc900 + (ulong)in_CL * 0x70);
  init_ms_buffers((MSBuffers *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  in_stack_ffffffffffffff48);
  av1_set_mv_search_method(in_RDI,in_stack_00000008,in_stack_00000010);
  in_RDI->mesh_patterns[0] = (MESH_PATTERN *)((long)in_RSI + 0x60a04);
  in_RDI->mesh_patterns[1] = (MESH_PATTERN *)((long)in_RSI + 0x60a24);
  in_RDI->force_mesh_thresh = (int)in_RSI[0xc140];
  in_RDI->prune_mesh_search = (uint)((int)in_RSI[0xc149] == 2);
  in_RDI->mesh_search_mv_diff_threshold = 4;
  in_RDI->run_mesh_search = 0;
  in_RDI->fine_search_interval = in_stack_00000018;
  in_RDI->is_intra_mode = 0;
  in_RDI->fast_obmc_search = (int)in_RSI[0xc14a];
  uVar2 = *(undefined8 *)(in_RDX + 0x1f6e4);
  (in_RDI->mv_limits).col_min = (int)uVar2;
  (in_RDI->mv_limits).col_max = (int)((ulong)uVar2 >> 0x20);
  uVar2 = *(undefined8 *)(in_RDX + 0x1f6ec);
  (in_RDI->mv_limits).row_min = (int)uVar2;
  (in_RDI->mv_limits).row_max = (int)((ulong)uVar2 >> 0x20);
  av1_set_mv_search_range(&in_RDI->mv_limits,in_R8);
  if ((int)in_RSI[0x846a] == 3) {
    in_stack_ffffffffffffff60 = *(int *)(in_RDX + 0x1a0) * 4 + 8;
    in_stack_ffffffffffffff58 = *(int *)(in_RDX + 0x1a4) * 4 + 8;
    in_stack_ffffffffffffff5c =
         ((*(int *)((long)in_RSI + 0x3bfbc) +
          (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_CL]
          * -4) - in_stack_ffffffffffffff60) + 0x10;
    in_stack_ffffffffffffff54 =
         (((int)in_RSI[0x77f7] +
          (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_CL]
          * -4) - in_stack_ffffffffffffff58) + 0x10;
    pFVar8 = &in_RDI->mv_limits;
    iVar7 = (in_RDI->mv_limits).row_min;
    if (iVar7 == -in_stack_ffffffffffffff60 ||
        SBORROW4(iVar7,-in_stack_ffffffffffffff60) != iVar7 + in_stack_ffffffffffffff60 < 0) {
      in_stack_ffffffffffffff60 = -in_stack_ffffffffffffff60;
    }
    else {
      in_stack_ffffffffffffff60 = (in_RDI->mv_limits).row_min;
    }
    (in_RDI->mv_limits).row_min = in_stack_ffffffffffffff60;
    if ((in_RDI->mv_limits).row_max < in_stack_ffffffffffffff5c) {
      in_stack_ffffffffffffff5c = (in_RDI->mv_limits).row_max;
    }
    (in_RDI->mv_limits).row_max = in_stack_ffffffffffffff5c;
    if (-in_stack_ffffffffffffff58 < pFVar8->col_min) {
      in_stack_ffffffffffffff58 = pFVar8->col_min;
    }
    else {
      in_stack_ffffffffffffff58 = -in_stack_ffffffffffffff58;
    }
    pFVar8->col_min = in_stack_ffffffffffffff58;
    if ((in_RDI->mv_limits).col_max < in_stack_ffffffffffffff54) {
      in_stack_ffffffffffffff54 = (in_RDI->mv_limits).col_max;
    }
    (in_RDI->mv_limits).col_max = in_stack_ffffffffffffff54;
  }
  init_mv_cost_params((MV_COST_PARAMS *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (MvCosts *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (MV *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  in_RDI->sdf = in_RDI->vfp->sdf;
  in_RDI->sdx4df = in_RDI->vfp->sdx4df;
  in_RDI->sdx3df = in_RDI->vfp->sdx3df;
  if ((*(int *)((long)in_RSI + 0x60a5c) == 2) && (0xf < block_size_high[in_CL])) {
    in_RDI->sdf = in_RDI->vfp->sdsf;
    in_RDI->sdx4df = in_RDI->vfp->sdsx4df;
    in_RDI->sdx3df = in_RDI->vfp->sdsx4df;
  }
  else if ((*(int *)((long)in_RSI + 0x60a5c) == 1) &&
          ((0xf < block_size_high[in_CL] && (cVar1 != '\0')))) {
    clamp_fullmv((FULLPEL_MV *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (FullMvLimits *)in_stack_ffffffffffffff48);
    iVar7 = ((in_RDI->ms_buffers).ref)->stride;
    puVar9 = get_buf_from_fullmv((buf_2d *)
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                 (FULLPEL_MV *)in_stack_ffffffffffffff48);
    pbVar3 = (in_RDI->ms_buffers).src;
    puVar4 = pbVar3->buf;
    iVar10 = pbVar3->stride;
    uVar5 = (*in_RDI->vfp->sdsf)(puVar4,iVar10,puVar9,iVar7);
    uVar6 = (*in_RDI->vfp->sdsf)(puVar4 + iVar10,iVar10,puVar9 + iVar7,iVar7);
    iVar7 = uVar5 - uVar6;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    if (iVar7 * 4 < (int)uVar5) {
      in_RDI->sdf = in_RDI->vfp->sdsf;
      in_RDI->sdx4df = in_RDI->vfp->sdsx4df;
      in_RDI->sdx3df = in_RDI->vfp->sdsx4df;
    }
  }
  return;
}

Assistant:

void av1_make_default_fullpel_ms_params(
    FULLPEL_MOTION_SEARCH_PARAMS *ms_params, const struct AV1_COMP *cpi,
    MACROBLOCK *x, BLOCK_SIZE bsize, const MV *ref_mv, FULLPEL_MV start_mv,
    const search_site_config search_sites[NUM_DISTINCT_SEARCH_METHODS],
    SEARCH_METHODS search_method, int fine_search_interval) {
  const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
  const int is_key_frame =
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index] == KF_UPDATE;

  // High level params
  ms_params->bsize = bsize;
  ms_params->vfp = &cpi->ppi->fn_ptr[bsize];

  init_ms_buffers(&ms_params->ms_buffers, x);

  av1_set_mv_search_method(ms_params, search_sites, search_method);

  ms_params->mesh_patterns[0] = mv_sf->mesh_patterns;
  ms_params->mesh_patterns[1] = mv_sf->intrabc_mesh_patterns;
  ms_params->force_mesh_thresh = mv_sf->exhaustive_searches_thresh;
  ms_params->prune_mesh_search =
      (cpi->sf.mv_sf.prune_mesh_search == PRUNE_MESH_SEARCH_LVL_2) ? 1 : 0;
  ms_params->mesh_search_mv_diff_threshold = 4;
  ms_params->run_mesh_search = 0;
  ms_params->fine_search_interval = fine_search_interval;

  ms_params->is_intra_mode = 0;

  ms_params->fast_obmc_search = mv_sf->obmc_full_pixel_search_level;

  ms_params->mv_limits = x->mv_limits;
  av1_set_mv_search_range(&ms_params->mv_limits, ref_mv);

  if (cpi->oxcf.algo_cfg.sharpness == 3) {
    int top_margin = x->e_mbd.mi_row * MI_SIZE + 8;
    int left_margin = x->e_mbd.mi_col * MI_SIZE + 8;
    int bottom_margin =
        cpi->common.height - mi_size_high[bsize] * MI_SIZE - top_margin + 16;
    int right_margin =
        cpi->common.width - mi_size_wide[bsize] * MI_SIZE - left_margin + 16;
    FullMvLimits *mv_limits = &ms_params->mv_limits;
    mv_limits->row_min = AOMMAX(mv_limits->row_min, -top_margin);
    mv_limits->row_max = AOMMIN(mv_limits->row_max, bottom_margin);
    mv_limits->col_min = AOMMAX(mv_limits->col_min, -left_margin);
    mv_limits->col_max = AOMMIN(mv_limits->col_max, right_margin);
  }

  // Mvcost params
  init_mv_cost_params(&ms_params->mv_cost_params, x->mv_costs, ref_mv,
                      x->errorperbit, x->sadperbit);

  ms_params->sdf = ms_params->vfp->sdf;
  ms_params->sdx4df = ms_params->vfp->sdx4df;
  ms_params->sdx3df = ms_params->vfp->sdx3df;

  if (mv_sf->use_downsampled_sad == 2 && block_size_high[bsize] >= 16) {
    assert(ms_params->vfp->sdsf != NULL);
    ms_params->sdf = ms_params->vfp->sdsf;
    assert(ms_params->vfp->sdsx4df != NULL);
    ms_params->sdx4df = ms_params->vfp->sdsx4df;
    // Skip version of sadx3 is not available yet
    ms_params->sdx3df = ms_params->vfp->sdsx4df;
  } else if (mv_sf->use_downsampled_sad == 1 && block_size_high[bsize] >= 16 &&
             !is_key_frame) {
    FULLPEL_MV start_mv_clamped = start_mv;
    // adjust start_mv to make sure it is within MV range
    clamp_fullmv(&start_mv_clamped, &ms_params->mv_limits);

    const struct buf_2d *const ref = ms_params->ms_buffers.ref;
    const int ref_stride = ref->stride;
    const uint8_t *best_address = get_buf_from_fullmv(ref, &start_mv_clamped);
    const struct buf_2d *const src = ms_params->ms_buffers.src;
    const uint8_t *src_buf = src->buf;
    const int src_stride = src->stride;

    unsigned int start_mv_sad_even_rows, start_mv_sad_odd_rows;
    assert(ms_params->vfp->sdsf != NULL);
    start_mv_sad_even_rows =
        ms_params->vfp->sdsf(src_buf, src_stride, best_address, ref_stride);
    start_mv_sad_odd_rows =
        ms_params->vfp->sdsf(src_buf + src_stride, src_stride,
                             best_address + ref_stride, ref_stride);

    // If the absolute SAD difference computed between the pred-to-src of even
    // and odd rows is small, skip every other row in sad computation.
    const int odd_to_even_diff_sad =
        abs((int)start_mv_sad_even_rows - (int)start_mv_sad_odd_rows);
    const int mult_thresh = 4;
    if (odd_to_even_diff_sad * mult_thresh < (int)start_mv_sad_even_rows) {
      ms_params->sdf = ms_params->vfp->sdsf;
      assert(ms_params->vfp->sdsx4df != NULL);
      ms_params->sdx4df = ms_params->vfp->sdsx4df;
      ms_params->sdx3df = ms_params->vfp->sdsx4df;
    }
  }
}